

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter
          (ScopedFakeTestPartResultReporter *this)

{
  UnitTestImpl *this_00;
  UnitTestImpl *impl;
  ScopedFakeTestPartResultReporter *this_local;
  
  (this->super_TestPartResultReporterInterface)._vptr_TestPartResultReporterInterface =
       (_func_int **)&PTR__ScopedFakeTestPartResultReporter_001d2b20;
  this_00 = internal::GetUnitTestImpl();
  if (this->intercept_mode_ == INTERCEPT_ALL_THREADS) {
    internal::UnitTestImpl::SetGlobalTestPartResultReporter(this_00,this->old_reporter_);
  }
  else {
    internal::UnitTestImpl::SetTestPartResultReporterForCurrentThread(this_00,this->old_reporter_);
  }
  TestPartResultReporterInterface::~TestPartResultReporterInterface
            (&this->super_TestPartResultReporterInterface);
  return;
}

Assistant:

ScopedFakeTestPartResultReporter::~ScopedFakeTestPartResultReporter() {
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  if (intercept_mode_ == INTERCEPT_ALL_THREADS) {
    impl->SetGlobalTestPartResultReporter(old_reporter_);
  } else {
    impl->SetTestPartResultReporterForCurrentThread(old_reporter_);
  }
}